

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu_com.c
# Opt level: O2

MPP_RET adjust_input(H264dVdpuPriv_t *priv,DXVA_Slice_H264_Long *p_long,DXVA_PicParams_H264_MVC *pp)

{
  H264dVdpuDpbInfo_t *__s;
  DXVA_PicEntry_H264 DVar1;
  undefined3 uVar2;
  RK_U16 RVar3;
  RK_S32 *pRVar4;
  RK_U32 *pRVar5;
  RK_U16 *pRVar6;
  RK_U8 *pRVar7;
  long lVar8;
  long lVar9;
  DXVA_PicEntry_H264 (*paDVar10) [32];
  H264dVdpuDpbInfo_t *pHVar11;
  uint uVar12;
  RK_S32 *pRVar13;
  H264dVdpuDpbInfo_t *pHVar14;
  long lVar15;
  H264dVdpuDpbInfo_t *pHVar16;
  H264dVdpuDpbInfo_t *pHVar17;
  ulong uVar18;
  bool bVar19;
  H264dVdpuDpbInfo_t *new_dpb;
  byte bVar20;
  anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *paVar21;
  anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *pic;
  byte bVar22;
  
  bVar22 = 0;
  __s = priv->new_dpb;
  bVar20 = 0;
  memset(__s,0,0x440);
  memset(priv->refinfo,0,0x480);
  pRVar5 = &priv->new_dpb[0].is_ilt_flag;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    if (pp->RefFrameList[lVar9].field_0.bPicEntry != 0xff) {
      ((H264dVdpuDpbInfo_t *)(pRVar5 + -0xd))->valid = '\x01';
      DVar1.field_0 =
           (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)
           pp->RefFrameList[lVar9].field_0.bPicEntry;
      pRVar5[-0xb] = (uint)((byte)DVar1.field_0 >> 7);
      pRVar5[-0xc] = pp->RefFrameList[lVar9].field_0.bPicEntry & 0x7f;
      pRVar5[-10] = pp->FieldOrderCntList[lVar9][0];
      pRVar5[-9] = pp->FieldOrderCntList[lVar9][1];
      if ((char)DVar1.field_0 < '\0') {
        pRVar5[-7] = (uint)pp->FrameNumList[lVar9];
      }
      else {
        *(RK_U16 *)(pRVar5 + -8) = pp->FrameNumList[lVar9];
      }
      pRVar5[-6] = (uint)pp->LongTermPicNumList[lVar9];
      uVar12 = pp->UsedForReferenceFlags >> (bVar20 & 0x1f);
      pRVar5[-5] = uVar12 & 1;
      pRVar5[-4] = (uVar12 & 2) >> 1;
      uVar12 = (uint)lVar9;
      pRVar5[-2] = (uint)((pp->RefPicColmvUsedFlags >> (uVar12 & 0x1f) & 1) != 0);
      pRVar5[-1] = (uint)((pp->RefPicFiledFlags >> (uVar12 & 0x1f) & 1) != 0);
      *pRVar5 = (uint)((pp->UsedForInTerviewflags >> (uVar12 & 0x1f) & 1) != 0);
    }
    bVar20 = bVar20 + 2;
    pRVar5 = pRVar5 + 0x11;
  }
  pRVar6 = pp->ViewIDList;
  for (lVar9 = 0x456; lVar9 != 0x676; lVar9 = lVar9 + 0x22) {
    *(uint *)((long)(priv->old_dpb + -1) + 0x43c + lVar9 * 2) = (uint)*pRVar6;
    pRVar6 = pRVar6 + 1;
  }
  pRVar7 = pp->RefPicLayerIdList;
  for (lVar9 = 0x8bc; lVar9 != 0xcfc; lVar9 = lVar9 + 0x44) {
    *(uint *)((long)(priv->old_dpb + -1) + 0x43c + lVar9) = (uint)*pRVar7;
    pRVar7 = pRVar7 + 1;
  }
  paVar21 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0 *)p_long->RefPicList;
  pRVar4 = &priv->refinfo[0][0].bottom_flag;
  paDVar10 = (DXVA_PicEntry_H264 (*) [32])paVar21;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    pRVar13 = pRVar4;
    for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 1) {
      if ((*paDVar10)[lVar15].field_0.bPicEntry != 0xff) {
        ((H264dVdpuRefPicInfo_t *)(pRVar13 + -2))->valid = 1;
        pRVar13[-1] = (*paDVar10)[lVar15].field_0.bPicEntry & 0x7f;
        *pRVar13 = (uint)((*paDVar10)[lVar15].field_0.bPicEntry >> 7);
      }
      pRVar13 = pRVar13 + 3;
    }
    pRVar4 = pRVar4 + 0x60;
    paDVar10 = paDVar10 + 1;
  }
  uVar18 = (ulong)priv->layed_id;
  pHVar11 = priv->old_dpb[uVar18];
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    pHVar16 = pHVar11 + lVar9;
    if (pHVar11[lVar9].valid != '\0') {
      lVar15 = 0;
LAB_001d5f12:
      if (lVar15 != 0x440) {
        if ((&__s->valid)[lVar15] == '\0') goto LAB_001d5f7b;
        bVar19 = pHVar16->slot_index == *(int *)((long)&priv->new_dpb[0].slot_index + lVar15) &&
                 pHVar16->frame_num == *(RK_U16 *)((long)&priv->new_dpb[0].frame_num + lVar15);
        if (((*(int *)((long)&priv->new_dpb[0].top_used + lVar15) != 0) && (pHVar16->top_used != 0))
           && (pHVar16->top_poc != *(int *)((long)&priv->new_dpb[0].top_poc + lVar15))) {
          bVar19 = false;
        }
        if ((((*(int *)((long)&priv->new_dpb[0].bot_used + lVar15) != 0) && (pHVar16->bot_used != 0)
             ) && (pHVar16->bot_poc != *(int *)((long)&priv->new_dpb[0].bot_poc + lVar15))) ||
           (!bVar19)) goto LAB_001d5f7b;
        (&priv->new_dpb[0].have_same)[lVar15] = '\x01';
        *(int *)((long)&priv->new_dpb[0].new_dpb_idx + lVar15) = (int)lVar9;
        pRVar7 = &__s->valid + lVar15;
        for (lVar8 = 0x11; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined4 *)pHVar16 = *(undefined4 *)pRVar7;
          pRVar7 = pRVar7 + ((ulong)bVar22 * -2 + 1) * 4;
          pHVar16 = (H264dVdpuDpbInfo_t *)((long)pHVar16 + (ulong)bVar22 * -8 + 4);
        }
        goto LAB_001d5faa;
      }
    }
    pHVar16->field_flag = 0;
    pHVar16->is_ilt_flag = 0;
    pHVar16->voidx = 0;
    pHVar16->have_same = '\0';
    *(undefined3 *)&pHVar16->field_0x3d = 0;
    pHVar16->top_used = 0;
    pHVar16->bot_used = 0;
    pHVar16->view_id = 0;
    pHVar16->colmv_is_used = 0;
    pHVar16->bot_poc = 0;
    pHVar16->frame_num = 0;
    *(undefined2 *)&pHVar16->field_0x16 = 0;
    pHVar16->long_term_frame_idx = 0;
    pHVar16->long_term_pic_num = 0;
    pHVar16->valid = '\0';
    *(undefined3 *)&pHVar16->field_0x1 = 0;
    pHVar16->slot_index = 0;
    pHVar16->is_long_term = 0;
    pHVar16->top_poc = 0;
    pHVar16->new_dpb_idx = 0;
LAB_001d5faa:
  }
  lVar9 = 0;
LAB_001d5fb8:
  if (lVar9 != 0x10) {
    if ((__s[lVar9].valid != '\0') && (pHVar16 = __s + lVar9, pHVar16->have_same == '\0')) {
      pHVar17 = pHVar11;
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
        lVar8 = 0x11;
        pHVar14 = pHVar16;
        if (pHVar17->valid == '\0') goto code_r0x001d5ff2;
        pHVar17 = pHVar17 + 1;
      }
    }
    goto LAB_001d5ff8;
  }
  priv->ilt_dpb = (H264dVdpuDpbInfo_t *)0x0;
  if (uVar18 != 0) {
    for (lVar9 = 0; lVar9 != 0x440; lVar9 = lVar9 + 0x44) {
      if (((&pHVar11->valid)[lVar9] == '\0') &&
         (*(int *)((long)&priv->old_dpb[uVar18][0].is_ilt_flag + lVar9) != 0)) {
        priv->ilt_dpb = (H264dVdpuDpbInfo_t *)(&pHVar11->valid + lVar9);
        break;
      }
    }
  }
  pRVar4 = &priv->refinfo[0][0].dpb_idx;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    for (lVar15 = 0; lVar15 != 0x180; lVar15 = lVar15 + 0xc) {
      if (*(int *)((long)pRVar4 + lVar15 + -4) != 0) {
        *(RK_U32 *)((long)pRVar4 + lVar15) =
             priv->new_dpb[*(int *)((long)pRVar4 + lVar15)].new_dpb_idx;
      }
    }
    pRVar4 = pRVar4 + 0x60;
  }
  pp->UsedForReferenceFlags = 0;
  pp->RefPicColmvUsedFlags = 0;
  pp->RefPicFiledFlags = 0;
  pp->UsedForInTerviewflags = 0;
  bVar20 = 0;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    if (((H264dVdpuDpbInfo_t *)&pHVar11->valid)->valid == '\0') {
      pp->RefFrameList[lVar9].field_0 = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
      pp->FieldOrderCntList[lVar9] = (RK_S32  [2])0x0;
      pp->FrameNumList[lVar9] = 0;
      pp->LongTermPicNumList[lVar9] = 0;
    }
    else {
      fill_picture_entry(pp->RefFrameList + lVar9,pHVar11->slot_index,pHVar11->is_long_term);
      pp->FieldOrderCntList[lVar9][0] = pHVar11->top_poc;
      pp->FieldOrderCntList[lVar9][1] = pHVar11->bot_poc;
      if (pHVar11->is_long_term == 0) {
        RVar3 = pHVar11->frame_num;
      }
      else {
        RVar3 = (RK_U16)pHVar11->long_term_frame_idx;
      }
      pp->FrameNumList[lVar9] = RVar3;
      pp->LongTermPicNumList[lVar9] = (RK_U16)pHVar11->long_term_pic_num;
      if (pHVar11->top_used != 0) {
        pp->UsedForReferenceFlags = pp->UsedForReferenceFlags | 1 << (bVar20 & 0x1f);
      }
      if (pHVar11->bot_used != 0) {
        pp->UsedForReferenceFlags = pp->UsedForReferenceFlags | 2 << (bVar20 & 0x1f);
      }
      bVar22 = (byte)lVar9;
      if (pHVar11->colmv_is_used != 0) {
        pp->RefPicColmvUsedFlags = pp->RefPicColmvUsedFlags | (ushort)(1 << (bVar22 & 0x1f));
      }
      if (pHVar11->field_flag != 0) {
        pp->RefPicFiledFlags = pp->RefPicFiledFlags | (ushort)(1 << (bVar22 & 0x1f));
      }
      if (pHVar11->is_ilt_flag != 0) {
        pp->UsedForInTerviewflags = pp->UsedForInTerviewflags | (ushort)(1 << (bVar22 & 0x1f));
      }
    }
    bVar20 = bVar20 + 2;
    pHVar11 = pHVar11 + 1;
  }
  pRVar5 = &priv->old_dpb[uVar18][0].view_id;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    pp->ViewIDList[lVar9] = (RK_U16)*pRVar5;
    pRVar5 = pRVar5 + 0x11;
  }
  pRVar5 = &priv->old_dpb[uVar18][0].voidx;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    pp->RefPicLayerIdList[lVar9] = (RK_U8)*pRVar5;
    pRVar5 = pRVar5 + 0x11;
  }
  pRVar4 = &priv->refinfo[0][0].bottom_flag;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    pic = paVar21;
    for (lVar15 = 0; lVar15 != 0x180; lVar15 = lVar15 + 0xc) {
      if (*(int *)((long)pRVar4 + lVar15 + -8) == 0) {
        *pic = (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
      }
      else {
        fill_picture_entry((DXVA_PicEntry_H264 *)&pic->field_0,
                           *(RK_U32 *)((long)pRVar4 + lVar15 + -4),
                           *(RK_U32 *)((long)pRVar4 + lVar15));
      }
      pic = pic + 1;
    }
    paVar21 = paVar21 + 0x20;
    pRVar4 = pRVar4 + 0x60;
  }
  return MPP_OK;
LAB_001d5f7b:
  lVar15 = lVar15 + 0x44;
  goto LAB_001d5f12;
code_r0x001d5ff2:
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar2 = *(undefined3 *)&pHVar14->field_0x1;
    pHVar17->valid = pHVar14->valid;
    *(undefined3 *)&pHVar17->field_0x1 = uVar2;
    pHVar14 = (H264dVdpuDpbInfo_t *)((long)pHVar14 + (ulong)bVar22 * -8 + 4);
    pHVar17 = (H264dVdpuDpbInfo_t *)((long)pHVar17 + (ulong)bVar22 * -8 + 4);
  }
  pHVar16->new_dpb_idx = (RK_U32)lVar15;
LAB_001d5ff8:
  lVar9 = lVar9 + 1;
  goto LAB_001d5fb8;
}

Assistant:

MPP_RET adjust_input(H264dVdpuPriv_t *priv,
                     DXVA_Slice_H264_Long *p_long,
                     DXVA_PicParams_H264_MVC  *pp)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    get_info_input(priv, p_long, pp);
    //!< dpb mapping to new order
    {
        RK_U32 i = 0, j = 0;
        RK_U32 find_flag = 0;
        H264dVdpuDpbInfo_t *new_dpb = priv->new_dpb;
        H264dVdpuDpbInfo_t *old_dpb = priv->old_dpb[priv->layed_id];

#if DEBUG_REF_LIST
        {
            mpp_log("=== frame_num %d ===\n", pp->frame_num);
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                mpp_log("old_dpb[%d] frame_num=%d field=%d poc0=%d poc1=%d\n",
                        i, old_dpb[i].frame_num, old_dpb[i].field_flag, old_dpb[i].top_poc, old_dpb[i].bot_poc);
            }
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                mpp_log("new_dpb[%d] frame_num=%d field=%d poc0=%d poc1=%d\n",
                        i, new_dpb[i].frame_num, new_dpb[i].field_flag, new_dpb[i].top_poc, new_dpb[i].bot_poc);
            }
        }
#endif
        //!< delete old dpb
        for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
            find_flag = 0;
            if (old_dpb[i].valid) {
                for (j = 0; j < MPP_ARRAY_ELEMS(priv->new_dpb); j++) {
                    if (new_dpb[j].valid) {
                        find_flag =
                            ((old_dpb[i].frame_num == new_dpb[j].frame_num)
                             ? 1 : 0);
                        find_flag = ((old_dpb[i].slot_index
                                      == new_dpb[j].slot_index)
                                     ? find_flag : 0);
                        if (new_dpb[j].top_used && old_dpb[i].top_used) {
                            find_flag =
                                ((old_dpb[i].top_poc == new_dpb[j].top_poc)
                                 ? find_flag : 0);
                        }
                        if (new_dpb[j].bot_used && old_dpb[i].bot_used) {
                            find_flag  =
                                ((old_dpb[i].bot_poc == new_dpb[j].bot_poc)
                                 ? find_flag : 0);
                        }
                        if (find_flag) { //!< found
                            new_dpb[j].have_same = 1;
                            new_dpb[j].new_dpb_idx = i;
                            old_dpb[i] = new_dpb[j];
                            break;
                        }
                    }
                }
            }
            //!< not found
            if (find_flag == 0) {
                memset(&old_dpb[i], 0, sizeof(old_dpb[i]));
            }
        }
        //!< add new dpb
        for (j = 0; j < MPP_ARRAY_ELEMS(priv->new_dpb); j++) {
            if ((new_dpb[j].valid == 0) || new_dpb[j].have_same) {
                continue;
            }
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                if (old_dpb[i].valid == 0) {
                    old_dpb[i] = new_dpb[j];
                    new_dpb[j].new_dpb_idx = i;
                    break;
                }
            }
        }
        //!< inter-layer reference
        priv->ilt_dpb = NULL;
        if (priv->layed_id) {
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[1]); i++) {
                if ((old_dpb[i].valid == 0) && old_dpb[i].is_ilt_flag) {
                    priv->ilt_dpb = &old_dpb[i];
                    break;
                }
            }
        }
    }
    //!< addjust ref_dpb
    {
        RK_U32 i = 0, j = 0;
        H264dVdpuDpbInfo_t *new_dpb = priv->new_dpb;

        for (j = 0; j < 3; j++) {
            H264dVdpuRefPicInfo_t *p = priv->refinfo[j];
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->refinfo[j]); i++) {
                if (p[i].valid) {
                    p[i].dpb_idx = new_dpb[p[i].dpb_idx].new_dpb_idx;
                }
            }
        }
    }
    refill_info_input(priv, p_long, pp);

    return ret = MPP_OK;
}